

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu_x86.c
# Opt level: O1

SHEMU_STATUS ShemuX86SetOperandValue(SHEMU_CONTEXT *Context,ND_UINT32 Operand,SHEMU_VALUE *Value)

{
  byte *pbVar1;
  PND_OPERAND Operand_00;
  char cVar2;
  ND_UINT8 NVar3;
  ushort uVar4;
  ND_REG_TYPE NVar5;
  int iVar6;
  ND_UINT32 NVar7;
  sbyte sVar8;
  bool bVar9;
  ND_BOOL NVar10;
  SHEMU_STATUS SVar11;
  ND_UINT64 NVar12;
  ulong uVar13;
  uint uVar14;
  ND_UINT64 Start;
  ND_SIZET n;
  ND_UINT64 NVar15;
  ND_UINT8 *pNVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  byte local_39;
  long lStack_38;
  uchar c;
  
  lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
  Operand_00 = (PND_OPERAND)((long)&Context->Arch + (ulong)Operand * 0x20 + 0x40);
  NVar10 = ShemuIsStackPtr(Context,(Value->Value).Qwords[0],(ulong)Context->StrThreshold);
  if (NVar10 != '\0') {
    if (Context->StrThreshold == 0) {
      uVar14 = 0;
    }
    else {
      NVar12 = (Value->Value).Qwords[0];
      uVar17 = 0;
      uVar14 = 0;
      do {
        SVar11 = ShemuMemLoad(Context,NVar12 + uVar17,1,&local_39);
        if ((SVar11 == 0) &&
           (((((byte)(local_39 - 0x2f) < 0xc || ((byte)((local_39 & 0xdf) + 0xbf) < 0x1a)) ||
             (local_39 == 0x5c)) || (local_39 == 0x20)))) {
          uVar14 = uVar14 + 1;
          bVar9 = true;
        }
        else {
          bVar9 = false;
        }
      } while ((bVar9) && (uVar17 = uVar17 + 1, uVar17 < Context->StrThreshold));
    }
    if (Context->StrThreshold <= uVar14) {
      *(byte *)&Context->Flags = (byte)Context->Flags | 0x20;
    }
  }
  if ((*(byte *)Operand_00 & 0xf) == 2) {
    NVar12 = ShemuX86ComputeLinearAddress(Context,Operand_00);
    NVar10 = ShemuIsShellcodePtr(Context,NVar12,(ulong)Operand_00->Size);
    if (NVar10 != '\0') {
      if ((Context->Options & 0x20) == 0) {
        pNVar16 = Context->Intbuf + Context->StackSize;
      }
      else {
        pNVar16 = (ND_UINT8 *)0x0;
      }
      if ((Context->Options & 0x20) == 0) {
        NVar15 = Context->ShellcodeSize;
      }
      else {
        NVar15 = 0;
      }
      ShemuBmpStateUpdate(pNVar16,NVar15,NVar12 - Context->ShellcodeBase,(ulong)Operand_00->Size,
                          '\x01','\0');
    }
    uVar14 = *(uint *)((long)&Context->Arch + 0xc) & 0xf;
    if (uVar14 < Operand_00->Size) {
      uVar14 = Operand_00->Size;
    }
    NVar10 = ShemuIsStackPtr(Context,NVar12,(ulong)uVar14);
    if (NVar10 != '\0') {
      iVar6 = *(int *)((long)&Context->Arch + 0x1a8);
      if (iVar6 - 0x49U < 2) {
        pNVar16 = Context->Intbuf;
        NVar15 = Context->StackSize;
        Start = NVar12 - Context->StackBase;
LAB_00163cb6:
        uVar17 = (ulong)((uint)*(undefined8 *)((long)&Context->Arch + 0xc) & 0xf);
LAB_00163cbd:
        NVar10 = '\0';
      }
      else {
        if (iVar6 - 0x10dU < 2) {
          pNVar16 = Context->Intbuf;
          NVar15 = Context->StackSize;
          Start = (NVar12 - Context->StackBase) + 8;
          goto LAB_00163cb6;
        }
        if (iVar6 == 0xed) {
          pNVar16 = Context->Intbuf;
          NVar15 = Context->StackSize;
          Start = (NVar12 - Context->StackBase) + 0xc;
          uVar13 = (ulong)((uint)*(undefined8 *)((long)&Context->Arch + 0xc) & 0xf);
          uVar17 = 4;
          if (uVar13 < 4) {
            uVar17 = uVar13;
          }
          goto LAB_00163cbd;
        }
        pNVar16 = Context->Intbuf;
        NVar15 = Context->StackSize;
        Start = NVar12 - Context->StackBase;
        uVar17 = (ulong)Operand_00->Size;
        NVar10 = '\x01';
      }
      ShemuBmpStateUpdate(pNVar16,NVar15,Start,uVar17,'\x01',NVar10);
    }
    uVar14 = Value->Size;
    if (Operand_00->Size < Value->Size) {
      uVar14 = Operand_00->Size;
    }
    SVar11 = ShemuMemStore(Context,NVar12,(ulong)uVar14,(ND_UINT8 *)Value);
    if (SVar11 != 0) goto switchD_00163b36_caseD_3;
    if ((Context->Options & 8) != 0) {
      ShemuDisplayMemValue(Context,NVar12,(ulong)Value->Size,(ND_UINT8 *)Value,'\0');
    }
    if (((byte)(Operand_00->Info).DefaultFlags & 0x80) != 0) {
      NVar12 = ShemuX86GetGprValue(Context,4,2 << (*(byte *)&Context->Arch >> 4 & 3),'\0');
      ShemuX86SetGprValue(Context,4,2 << (*(byte *)&Context->Arch >> 4 & 3),
                          NVar12 - Operand_00->Size,'\0');
    }
    if ((undefined1  [24])((undefined1  [24])Operand_00->Info & (undefined1  [24])0x100) !=
        (undefined1  [24])0x0) {
      SVar11 = 0;
      NVar12 = ShemuX86GetGprValue(Context,(uint)(*(byte *)((long)&Operand_00->Info + 10) >> 3),
                                   (uint)(Operand_00->Info).Memory.BaseSize,'\0');
      uVar17 = -(ulong)Operand_00->Size;
      if ((*(uint *)((long)&Context->Arch + 0x2f0) >> 10 & 1) == 0) {
        uVar17 = (ulong)Operand_00->Size;
      }
      ShemuX86SetGprValue(Context,(uint)(*(byte *)((long)&Operand_00->Info + 10) >> 3),
                          (uint)(Operand_00->Info).Memory.BaseSize,uVar17 + NVar12,'\0');
      goto switchD_00163b36_caseD_3;
    }
    goto LAB_0016400e;
  }
  SVar11 = 4;
  if ((*(byte *)Operand_00 & 0xf) != 1) goto switchD_00163b36_caseD_3;
  NVar5 = (Operand_00->Info).Register.Type;
  SVar11 = 6;
  switch(NVar5) {
  case ND_REG_GPR:
    if ((((*(int *)((long)&Context->Arch + 0x1a8) == 0x6c4) &&
         ((Operand_00->Info).Register.Reg == 4)) &&
        (((uint)((Context->Arch).X86.Mode == '\x02') * 4 + 3 & (uint)(Value->Value).Qwords[0]) == 0)
        ) && ((NVar10 = ShemuIsShellcodePtr(Context,(Value->Value).Qwords[0],0x40), NVar10 != '\0'
              || (NVar10 = ShemuIsStackPtr(Context,(Value->Value).Qwords[0],0x40), NVar10 != '\0')))
       ) {
      pbVar1 = (byte *)((long)&Context->Flags + 1);
      *pbVar1 = *pbVar1 | 1;
    }
    ShemuX86SetGprValue(Context,(Operand_00->Info).Register.Reg,Operand_00->Size,
                        (Value->Value).Qwords[0],*(byte *)((long)&Operand_00->Info + 0xd) & 1);
    break;
  case ND_REG_SEG:
    NVar7 = (Operand_00->Info).Register.Reg;
    uVar4 = (Value->Value).Words[0];
    uVar17 = (ulong)uVar4;
    if (((uVar4 != 0) || (NVar7 == 2)) || ((Context->Arch).X86.Mode != '\x02')) {
      SVar11 = 0xb;
      if ((char)((uVar4 & 4) >> 2) != '\0' || 0x7f < uVar4) goto switchD_00163b36_caseD_3;
      NVar3 = (Context->Arch).X86.Ring;
      if (((uVar4 & 3) != 0 && NVar3 == '\0') || ((uVar4 & 3) != 3 && NVar3 == '\x03'))
      goto switchD_00163b36_caseD_3;
    }
    SVar11 = 0;
    switch(NVar7) {
    case 0:
      (Context->Arch).X86.Segments.Es.Selector = uVar17;
      break;
    case 1:
      (Context->Arch).X86.Segments.Cs.Selector = uVar17;
      break;
    case 2:
      (Context->Arch).X86.Segments.Ss.Selector = uVar17;
      break;
    case 3:
      (Context->Arch).X86.Segments.Ds.Selector = uVar17;
      break;
    case 4:
      (Context->Arch).X86.Segments.Fs.Selector = uVar17;
      break;
    case 5:
      (Context->Arch).X86.Segments.Gs.Selector = uVar17;
    }
  case ND_REG_FPU:
    goto switchD_00163b36_caseD_3;
  case ND_REG_MMX:
    *(ND_UINT64 *)((long)&Context->Arch + (ulong)(Operand_00->Info).Register.Reg * 8 + 0x410) =
         (Value->Value).Qwords[0];
    if ((Context->Options & 1) != 0) {
      SVar11 = 0;
      shemu_internal_printf
                (Context,"        MM%d = 0x%016llx\n",(ulong)(Operand_00->Info).Register.Reg,
                 (Value->Value).Qwords[0]);
      goto switchD_00163b36_caseD_3;
    }
    break;
  case ND_REG_SSE:
    n = 0x40;
    if (((undefined1  [3192])Context->Arch & (undefined1  [3192])0xf0000) == (undefined1  [3192])0x0
       ) {
      n = 0x10;
    }
    SVar11 = 0;
    nd_memset((void *)((long)&Context->Arch + (ulong)(Operand_00->Info).Register.Reg * 0x40 + 0x450)
              ,0,n);
    shemu_memcpy((void *)((long)&Context->Arch +
                         (ulong)(Operand_00->Info).Register.Reg * 0x40 + 0x450),Value,
                 (ulong)Operand_00->Size);
    if ((Context->Options & 1) != 0) {
      uVar17 = (ulong)((Operand_00->Size != 0x20) + 0x59);
      if (Operand_00->Size == 0x10) {
        uVar17 = 0x58;
      }
      SVar11 = 0;
      shemu_internal_printf
                (Context,"        %cMM%d (HI_32) = 0x%016llx%016llx%016llx%016llx\n",uVar17,
                 (ulong)(Operand_00->Info).Register.Reg,(Value->Value).Qwords[7],
                 (Value->Value).Qwords[6],(Value->Value).Qwords[5],(Value->Value).Qwords[4]);
      uVar14 = (Operand_00->Size != 0x20) + 0x59;
      if (Operand_00->Size == 0x10) {
        uVar14 = 0x58;
      }
      shemu_internal_printf
                (Context,"        %cMM%d (LO_32) = 0x%016llx%016llx%016llx%016llx\n",(ulong)uVar14,
                 (ulong)(Operand_00->Info).Register.Reg,(Value->Value).Qwords[3],
                 (Value->Value).Qwords[2],(Value->Value).Qwords[1],(Value->Value).Qwords[0]);
    }
    goto switchD_00163b36_caseD_3;
  case ND_REG_CR:
    switch((Operand_00->Info).Register.Reg) {
    case 0:
      (Context->Arch).X86.Registers.RegCr0 = (Value->Value).Qwords[0];
      break;
    default:
      goto switchD_00163b36_caseD_3;
    case 2:
      (Context->Arch).X86.Registers.RegCr2 = (Value->Value).Qwords[0];
      break;
    case 3:
      (Context->Arch).X86.Registers.RegCr3 = (Value->Value).Qwords[0];
      break;
    case 4:
      (Context->Arch).X86.Registers.RegCr4 = (Value->Value).Qwords[0];
      break;
    case 8:
      (Context->Arch).X86.Registers.RegCr8 = (Value->Value).Qwords[0];
    }
    break;
  default:
    if (NVar5 == ND_REG_FLG) {
      if (Operand_00->Size == 2) {
        *(ND_UINT16 *)((long)&Context->Arch + 0x2f0) = (Value->Value).Words[0];
      }
      else {
        (Context->Arch).X86.Registers.RegFlags = (Value->Value).Qwords[0];
      }
      (Context->Arch).X86.Registers.RegFlags =
           (ulong)((uint)(Context->Arch).X86.Registers.RegFlags & 0x3f7fd5) | 2;
    }
    else {
      if (NVar5 != ND_REG_RIP) goto switchD_00163b36_caseD_3;
      cVar2 = (char)Value->Size;
      sVar8 = ((byte)(cVar2 * '\b') < 0x41) * (cVar2 * -8 + '@');
      (Context->Arch).X86.Registers.RegRip = ((Value->Value).Qwords[0] << sVar8) >> sVar8;
    }
  }
LAB_0016400e:
  SVar11 = 0;
switchD_00163b36_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_38) {
    return SVar11;
  }
  __stack_chk_fail();
}

Assistant:

static SHEMU_STATUS
ShemuX86SetOperandValue(
    SHEMU_CONTEXT *Context,
    ND_UINT32 Operand,
    SHEMU_VALUE *Value
    )
{
    SHEMU_STATUS status;
    PND_OPERAND op = &Context->Arch.X86.Instruction.Operands[Operand];

    // If a stack address is being loaded, check if it points to a string built on the stack.
    if (ShemuIsStackPtr(Context, Value->Value.Qwords[0], Context->StrThreshold))
    {
        ND_UINT64 sptr = Value->Value.Qwords[0];
        ND_UINT32 i, stckstrlen = 0;

        // Check if a string was saved on the stack. Typically used by shellcodes like this:
        // PUSH str0
        // PUSH str1
        // ...
        // PUSH strn
        // Other variants may exist, but all we care about are stores on the stack, and all are checked.

        for (i = 0; i < Context->StrThreshold; i++)
        {
            unsigned char c;

            status = ShemuMemLoad(Context, sptr + i, 1, &c);
            if (SHEMU_SUCCESS != status)
            {
                break;
            }

            if ((c >= 'a' && c <= 'z') || (c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') ||
                c == '\\' || c == '/' || c == ':' || c == ' ')
            {
                stckstrlen++;
            }
            else
            {
                break;
            }
        }

        if (stckstrlen >= Context->StrThreshold)
        {
            Context->Flags |= SHEMU_FLAG_STACK_STR;
        }
    }


    if (op->Type == ND_OP_REG)
    {
        switch (op->Info.Register.Type)
        {
        case ND_REG_GPR:
            if (Context->Arch.X86.Instruction.Instruction == ND_INS_XCHG &&
                op->Info.Register.Reg == NDR_RSP &&
                ShemuX86IsAddressAligned(Context, Value->Value.Qwords[0]))
            {
                // Conditions for a STACK_PIVOT detection:
                // 1. The instruction is XCHG
                // 2. The value loaded in the RSP register is naturally aligned
                // 3. The value points either inside the shellcode or the stack area, and at least 64 bytes are valid
                if (ShemuIsShellcodePtr(Context, Value->Value.Qwords[0], 64) ||
                    ShemuIsStackPtr(Context, Value->Value.Qwords[0], 64))
                {
                    Context->Flags |= SHEMU_FLAG_STACK_PIVOT;
                }
            }

            ShemuX86SetGprValue(Context, op->Info.Register.Reg, op->Size, Value->Value.Qwords[0], 
                             op->Info.Register.IsHigh8);
            break;

        case ND_REG_SEG:
            if (!ShemuX86IsSelectorValid(Context, op->Info.Register.Reg, Value->Value.Words[0]))
            {
                return SHEMU_ABORT_INVALID_SELECTOR;
            }
            ShemuX86SetSegValue(Context, op->Info.Register.Reg, Value->Value.Words[0]);
            break;

        case ND_REG_MMX:
            Context->Arch.X86.MmxRegisters[op->Info.Register.Reg] = Value->Value.Qwords[0];
            // Only log these when they're written.
            if (Context->Options & SHEMU_OPT_TRACE_EMULATION)
            {
                shemu_printf(Context, "        MM%d = 0x%016llx\n", op->Info.Register.Reg, Value->Value.Qwords[0]);
            }
            break;

        case ND_REG_SSE:
            if (Context->Arch.X86.Instruction.EncMode != ND_ENCM_LEGACY)
            {
                // Zero the entire register first, if we have a VEX/EVEX encoded instruction.
                nd_memzero(&Context->Arch.X86.SseRegisters[op->Info.Register.Reg], ND_MAX_REGISTER_SIZE);
            }
            else
            {
                // Zero upper bits in the 128 bits register, if operand size is less than 16 bytes.
                // Upper bits in the YMM/ZMM register are preserved.
                nd_memzero(&Context->Arch.X86.SseRegisters[op->Info.Register.Reg], 16);
            }
            // Copy the value.
            shemu_memcpy(&Context->Arch.X86.SseRegisters[op->Info.Register.Reg],
                         Value->Value.Bytes, 
                         op->Size);
            // Only log these when they're written.
            if (Context->Options & SHEMU_OPT_TRACE_EMULATION)
            {
                shemu_printf(Context,
                             "        %cMM%d (HI_32) = 0x%016llx%016llx%016llx%016llx\n",
                             op->Size == 16 ? 'X' : op->Size == 32 ? 'Y' : 'Z', op->Info.Register.Reg,
                             Value->Value.Qwords[7], Value->Value.Qwords[6], 
                             Value->Value.Qwords[5], Value->Value.Qwords[4]);
                shemu_printf(Context,
                             "        %cMM%d (LO_32) = 0x%016llx%016llx%016llx%016llx\n",
                             op->Size == 16 ? 'X' : op->Size == 32 ? 'Y' : 'Z', op->Info.Register.Reg,
                             Value->Value.Qwords[3], Value->Value.Qwords[2], 
                             Value->Value.Qwords[1], Value->Value.Qwords[0]);
            }
            break;

        case ND_REG_RIP:
            Context->Arch.X86.Registers.RegRip = ND_TRIM(Value->Size, Value->Value.Qwords[0]);
            break;

        case ND_REG_FLG:
            if (op->Size == 2)
            {
                *((ND_UINT16*)&Context->Arch.X86.Registers.RegFlags) = Value->Value.Words[0];
            }
            else
            {
                Context->Arch.X86.Registers.RegFlags = Value->Value.Qwords[0];
            }
            // Handle reserved bits.
            Context->Arch.X86.Registers.RegFlags |= (1ULL << 1);
            Context->Arch.X86.Registers.RegFlags &= ~((1ULL << 3) | (1ULL << 5) | (1ULL << 15));
            Context->Arch.X86.Registers.RegFlags &= 0x3FFFFF;
            break;

        case ND_REG_CR:
            switch (op->Info.Register.Reg)
            {
            case NDR_CR0:
                Context->Arch.X86.Registers.RegCr0 = Value->Value.Qwords[0];
                break;
            case NDR_CR2:
                Context->Arch.X86.Registers.RegCr2 = Value->Value.Qwords[0];
                break;
            case NDR_CR3:
                Context->Arch.X86.Registers.RegCr3 = Value->Value.Qwords[0];
                break;
            case NDR_CR4:
                Context->Arch.X86.Registers.RegCr4 = Value->Value.Qwords[0];
                break;
            case NDR_CR8:
                Context->Arch.X86.Registers.RegCr8 = Value->Value.Qwords[0];
                break;
            default:
                return SHEMU_ABORT_REGISTER_NOT_SUPPORTED;
            }
            break;

        default:
            return SHEMU_ABORT_REGISTER_NOT_SUPPORTED;
        }
    }
    else if (op->Type == ND_OP_MEM)
    {
        // Compute the GLA.
        ND_UINT64 gla = ShemuX86ComputeLinearAddress(Context, op);

        // Handle self-write. We store a 1 for each written byte inside the shellcode space. Once the modified bytes
        // are executed, we can trigger the self-write detection.
        if (ShemuIsShellcodePtr(Context, gla, op->Size))
        {
            ShemuShellBmpStateSet(Context, gla - Context->ShellcodeBase, op->Size, SHELL_BYTE_DIRTY);
        }

        // Handle RIP save on the stack.
        if (ShemuIsStackPtr(Context, gla, MAX(op->Size, Context->Arch.X86.Instruction.WordLength)))
        {
            // Note: only Context->Arch.X86.Instruction.WordLength bits are flagged as RIP, as that is the RIP size.
            if (Context->Arch.X86.Instruction.Instruction == ND_INS_CALLNR ||
                Context->Arch.X86.Instruction.Instruction == ND_INS_CALLNI)
            {
                ShemuStackBmpStateSet(Context, gla - Context->StackBase, 
                                      Context->Arch.X86.Instruction.WordLength, STACK_BYTE_RIP);
            }
            else if (Context->Arch.X86.Instruction.Instruction == ND_INS_FNSTENV)
            {
                // OK: op->Size will be the FPU state size (28 bytes); we only emulate 32 & 64 bit forms, the RIP is 
                // always 4 bytes.
                ShemuStackBmpStateSet(Context, (gla + 0xC) - Context->StackBase, 
                                      MIN(Context->Arch.X86.Instruction.WordLength, 4), STACK_BYTE_RIP);
            }
            else if (Context->Arch.X86.Instruction.Instruction == ND_INS_FXSAVE || 
                Context->Arch.X86.Instruction.Instruction == ND_INS_FXSAVE64)
            {
                // OK: op->Size will be the FXSAVE size (512 bytes).
                ShemuStackBmpStateSet(Context, (gla + 0x8) - Context->StackBase, 
                                      Context->Arch.X86.Instruction.WordLength, STACK_BYTE_RIP);
            }
            else
            {
                // Something is written on a previously saved RIP; reset it.
                ShemuStackBmpStateClear(Context, gla - Context->StackBase, op->Size, STACK_BYTE_RIP);
            }
        }

        // Set the value.
        status = ShemuMemStore(Context, gla, MIN(op->Size, Value->Size), Value->Value.Bytes);
        if (SHEMU_SUCCESS != status)
        {
            return status;
        }

        if (Context->Options & SHEMU_OPT_TRACE_MEMORY)
        {
            ShemuDisplayMemValue(Context, gla, Value->Size, Value->Value.Bytes, ND_FALSE);
        }

        // If this is a stack access, we need to update the stack pointer.
        if (op->Info.Memory.IsStack)
        {
            ND_UINT64 regval = ShemuX86GetGprValue(Context, NDR_RSP, (2 << Context->Arch.X86.Instruction.DefStack), ND_FALSE);

            regval -= op->Size;

            ShemuX86SetGprValue(Context, NDR_RSP, (2 << Context->Arch.X86.Instruction.DefStack), regval, ND_FALSE);
        }

        // If this is a string operation, make sure we update RSI/RDI.
        if (op->Info.Memory.IsString)
        {
            ND_UINT64 regval = ShemuX86GetGprValue(Context, op->Info.Memory.Base, op->Info.Memory.BaseSize, ND_FALSE);

            regval = GET_FLAG(Context, NDR_RFLAG_DF) ? regval - op->Size : regval + op->Size;

            ShemuX86SetGprValue(Context, op->Info.Memory.Base, op->Info.Memory.BaseSize, regval, ND_FALSE);
        }
    }
    else
    {
        return SHEMU_ABORT_OPERAND_NOT_SUPPORTED;
    }

    return SHEMU_SUCCESS;
}